

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemSubroutine.h
# Opt level: O0

void __thiscall slang::ast::NonConstantFunction::~NonConstantFunction(NonConstantFunction *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~NonConstantFunction((NonConstantFunction *)0x92b488);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

class SLANG_EXPORT NonConstantFunction : public SimpleSystemSubroutine {
public:
    NonConstantFunction(const std::string& name, const Type& returnType, size_t requiredArgs = 0,
                        const std::vector<const Type*>& argTypes = {}, bool isMethod = false) :
        SimpleSystemSubroutine(name, SubroutineKind::Function, requiredArgs, argTypes, returnType,
                               isMethod) {}

    NonConstantFunction(KnownSystemName knownNameId, const Type& returnType,
                        size_t requiredArgs = 0, const std::vector<const Type*>& argTypes = {},
                        bool isMethod = false) :
        SimpleSystemSubroutine(knownNameId, SubroutineKind::Function, requiredArgs, argTypes,
                               returnType, isMethod) {}

    ConstantValue eval(EvalContext& context, const Args&, SourceRange range,
                       const CallExpression::SystemCallInfo&) const final {
        notConst(context, range);
        return nullptr;
    }
}